

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

bool __thiscall QHttp2Connection::sendPing(QHttp2Connection *this)

{
  undefined1 uVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView data;
  QRandomGenerator gen;
  uint local_9fc;
  QRandomGenerator local_9f8;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  memset(&local_9f8,0xaa,0x9d0);
  local_9fc = 1;
  QRandomGenerator::QRandomGenerator(&local_9f8,&local_9fc,&local_9f8.type);
  lVar3 = 0;
  do {
    uVar1 = QRandomGenerator::_fillRange(&local_9f8,0);
    *(undefined1 *)((long)&local_28 + lVar3) = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  data.m_data = (storage_type *)&local_28;
  data.m_size = 8;
  bVar2 = sendPing(this,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendPing()
{
    std::array<char, 8> data;

    QRandomGenerator gen;
    gen.generate(data.begin(), data.end());
    return sendPing(data);
}